

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O2

void __thiscall OpenMD::GB::GB(GB *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_9;
  
  (this->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__GB_002c1c20;
  this->initialized_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name_,"GB",&local_9);
  p_Var1 = &(this->GBtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->forceField_ = (ForceField *)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GBtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MixingMap).
  super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mu_ = 2.0;
  this->nu_ = 1.0;
  return;
}

Assistant:

GB::GB() :
      initialized_(false), name_("GB"), forceField_(NULL), mu_(2.0), nu_(1.0) {}